

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.cc
# Opt level: O0

void __thiscall trng::yarn3s::seed(yarn3s *this,result_type s1,result_type s2,result_type s3)

{
  result_type s3_local;
  result_type s2_local;
  result_type s1_local;
  yarn3s *this_local;
  
  (this->S).r[0] = s1 % 0x7fffadb3;
  if ((this->S).r[0] < 0) {
    (this->S).r[0] = (this->S).r[0] + 0x7fffadb3;
  }
  (this->S).r[1] = s2 % 0x7fffadb3;
  if ((this->S).r[1] < 0) {
    (this->S).r[1] = (this->S).r[1] + 0x7fffadb3;
  }
  (this->S).r[2] = s3 % 0x7fffadb3;
  if ((this->S).r[2] < 0) {
    (this->S).r[2] = (this->S).r[2] + 0x7fffadb3;
  }
  return;
}

Assistant:

void yarn3s::seed(yarn3s::result_type s1, yarn3s::result_type s2, yarn3s::result_type s3) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
  }